

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O3

void mutex_cv_ping_pong(ping_pong *pp,int parity)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  nsync_time abs_deadline;
  
  __mutex = &pp->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  uVar1 = pp->i;
  if ((int)uVar1 < pp->limit) {
    do {
      while ((uVar1 & 1) == parity) {
        abs_deadline.tv_nsec = 999999999;
        abs_deadline.tv_sec = 0x7fffffffffffffff;
        nsync_cv_wait_with_deadline_generic
                  (pp->cv + (uint)parity,__mutex,void_pthread_mutex_lock,void_pthread_mutex_unlock,
                   abs_deadline,(nsync_note)0x0);
        uVar1 = pp->i;
      }
      pp->i = uVar1 + 1;
      nsync_cv_signal(pp->cv + (1 - parity));
      uVar1 = pp->i;
    } while ((int)uVar1 < pp->limit);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mutex_cv_ping_pong (ping_pong *pp, int parity) {
	pthread_mutex_lock (&pp->mutex);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_cv_wait_with_deadline_generic (&pp->cv[parity], &pp->mutex,
						             &void_pthread_mutex_lock,
						             &void_pthread_mutex_unlock,
						             nsync_time_no_deadline, NULL);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1-parity]);
	}

	pthread_mutex_unlock (&pp->mutex);
	ping_pong_done (pp);
}